

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t coda_strxspn(char *s,char *n,size_t len)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *x;
  char *e;
  char *p;
  char *local_30;
  char *local_20;
  
  for (local_20 = in_RDI; local_30 = in_RSI, local_20 < in_RDI + in_RDX; local_20 = local_20 + 1) {
    for (; *local_30 != '\0'; local_30 = local_30 + 1) {
      iVar1 = tolower((int)*local_20);
      iVar2 = tolower((int)*local_30);
      if (iVar1 == iVar2) break;
    }
    if (*local_30 == '\0') break;
  }
  return (long)local_20 - (long)in_RDI;
}

Assistant:

size_t coda_strxspn(const char *s, const char *n, size_t len)
{
	const char *p = s;
	const char *e = s + len;
	const char *x;

	for (; p < e; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}

		if (!*x) break;
	}

	return p - s;
}